

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GyroscopeSensor.cpp
# Opt level: O1

void __thiscall iDynTree::GyroscopeSensor::GyroscopeSensor(GyroscopeSensor *this)

{
  GyroscopePrivateAttributes *pGVar1;
  Transform local_80 [96];
  
  (this->super_LinkSensor).super_Sensor._vptr_Sensor = (_func_int **)&PTR__GyroscopeSensor_00185a10;
  pGVar1 = (GyroscopePrivateAttributes *)operator_new(0xa8);
  (pGVar1->name)._M_dataplus._M_p = (pointer)&(pGVar1->name).field_2;
  (pGVar1->name)._M_string_length = 0;
  (pGVar1->name).field_2._M_local_buf[0] = '\0';
  iDynTree::Transform::Transform(&pGVar1->link_H_sensor);
  (pGVar1->parent_link_name)._M_dataplus._M_p = (pointer)&(pGVar1->parent_link_name).field_2;
  (pGVar1->parent_link_name)._M_string_length = 0;
  (pGVar1->parent_link_name).field_2._M_local_buf[0] = '\0';
  this->pimpl = pGVar1;
  std::__cxx11::string::_M_replace((ulong)pGVar1,0,(char *)(pGVar1->name)._M_string_length,0x16f785)
  ;
  iDynTree::Transform::Identity();
  iDynTree::Transform::operator=(&this->pimpl->link_H_sensor,local_80);
  pGVar1 = this->pimpl;
  pGVar1->parent_link_index = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&pGVar1->parent_link_name,0,(char *)(pGVar1->parent_link_name)._M_string_length,
             0x16f785);
  return;
}

Assistant:

GyroscopeSensor::GyroscopeSensor()
{
    this->pimpl = new GyroscopePrivateAttributes;

    this->pimpl->name = "";
    this->pimpl->link_H_sensor = Transform::Identity();
    this->pimpl->parent_link_index = -1;
    this->pimpl->parent_link_name = "";
}